

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QKeyCombination>>
          (QtPrivate *this,QDebug debug,char *which,QList<QKeyCombination> *c)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  QDebug *pQVar4;
  QKeyCombination *pQVar5;
  QDebug debug_00;
  QKeyCombination *pQVar6;
  long in_FS_OFFSET;
  QDebug local_60;
  Stream local_58 [8];
  QDebug local_50;
  Stream local_48 [8];
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)debug.stream);
  *(undefined1 *)(*(long *)debug.stream + 0x30) = 0;
  pQVar4 = QDebug::operator<<((QDebug *)debug.stream,which);
  QDebug::operator<<(pQVar4,'(');
  pQVar6 = (c->d).ptr;
  lVar2 = (c->d).size;
  pQVar5 = pQVar6 + lVar2;
  if (lVar2 == 0) goto LAB_003e1bf1;
  local_50.stream = *debug.stream;
  pQVar4 = &local_50;
  *(int *)(local_50.stream + 0x28) = *(int *)(local_50.stream + 0x28) + 1;
  debug_00.stream = local_48;
  while( true ) {
    ::operator<<(debug_00,(QKeyCombination)(int)pQVar4);
    QDebug::~QDebug((QDebug *)debug_00.stream);
    QDebug::~QDebug(pQVar4);
    pQVar6 = pQVar6 + 1;
LAB_003e1bf1:
    if (pQVar6 == pQVar5) break;
    pQVar4 = QDebug::operator<<((QDebug *)debug.stream,", ");
    local_60.stream = pQVar4->stream;
    pQVar4 = &local_60;
    *(int *)(local_60.stream + 0x28) = *(int *)(local_60.stream + 0x28) + 1;
    debug_00.stream = local_58;
  }
  QDebug::operator<<((QDebug *)debug.stream,')');
  uVar3 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar3;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)(Stream *)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}